

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereAddIndexedExpr(Parse *pParse,Index *pIdx,int iIdxCur,SrcItem *pTabItem)

{
  Table *pTab_00;
  int iVar1;
  int iVar2;
  sqlite3 *db;
  undefined8 *puVar3;
  Expr *pEVar4;
  char *pcVar5;
  long in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  void *pArg;
  int j;
  Expr *pExpr;
  Table *pTab;
  IndexedExpr *p;
  int i;
  sqlite3 *in_stack_ffffffffffffffa8;
  Parse *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int local_24;
  
  pTab_00 = *(Table **)(in_RSI + 0x18);
  local_24 = 0;
  do {
    if ((int)(uint)*(ushort *)(in_RSI + 0x60) <= local_24) {
      return;
    }
    iVar1 = (int)*(short *)(*(long *)(in_RSI + 8) + (long)local_24 * 2);
    if (iVar1 == -2) {
      db = *(sqlite3 **)(*(long *)(in_RSI + 0x50) + 8 + (long)local_24 * 0x18);
LAB_001f894c:
      iVar2 = sqlite3ExprIsConstant(in_stack_ffffffffffffffb0,(Expr *)in_stack_ffffffffffffffa8);
      if (iVar2 == 0) {
        puVar3 = (undefined8 *)
                 sqlite3DbMallocRaw((sqlite3 *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                                    (u64)in_stack_ffffffffffffffb0);
        if (puVar3 == (undefined8 *)0x0) {
          return;
        }
        puVar3[3] = *(undefined8 *)(in_RDI + 0x60);
        pEVar4 = sqlite3ExprDup(db,(Expr *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                                (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
        *puVar3 = pEVar4;
        *(undefined4 *)(puVar3 + 1) = *(undefined4 *)(in_RCX + 0x1c);
        *(undefined4 *)((long)puVar3 + 0xc) = in_EDX;
        *(int *)(puVar3 + 2) = local_24;
        *(bool *)((long)puVar3 + 0x14) = (*(byte *)(in_RCX + 0x18) & 0x58) != 0;
        pcVar5 = sqlite3IndexAffinityStr(in_stack_ffffffffffffffa8,(Index *)0x1f8a14);
        if (pcVar5 != (char *)0x0) {
          *(undefined1 *)((long)puVar3 + 0x15) =
               *(undefined1 *)(*(long *)(in_RSI + 0x20) + (long)local_24);
        }
        *(undefined8 **)(in_RDI + 0x60) = puVar3;
        if (puVar3[3] == 0) {
          in_stack_ffffffffffffffb0 = (Parse *)(in_RDI + 0x60);
          sqlite3ParserAddCleanup
                    ((Parse *)db,
                     (_func_void_sqlite3_ptr_void_ptr *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                     in_stack_ffffffffffffffb0);
        }
      }
    }
    else if ((-1 < iVar1) && ((pTab_00->aCol[iVar1].colFlags & 0x20) != 0)) {
      db = (sqlite3 *)sqlite3ColumnExpr(pTab_00,pTab_00->aCol + iVar1);
      goto LAB_001f894c;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static SQLITE_NOINLINE void whereAddIndexedExpr(
  Parse *pParse,     /* Add IndexedExpr entries to pParse->pIdxEpr */
  Index *pIdx,       /* The index-on-expression that contains the expressions */
  int iIdxCur,       /* Cursor number for pIdx */
  SrcItem *pTabItem  /* The FROM clause entry for the table */
){
  int i;
  IndexedExpr *p;
  Table *pTab;
  assert( pIdx->bHasExpr );
  pTab = pIdx->pTable;
  for(i=0; i<pIdx->nColumn; i++){
    Expr *pExpr;
    int j = pIdx->aiColumn[i];
    if( j==XN_EXPR ){
      pExpr = pIdx->aColExpr->a[i].pExpr;
    }else if( j>=0 && (pTab->aCol[j].colFlags & COLFLAG_VIRTUAL)!=0 ){
      pExpr = sqlite3ColumnExpr(pTab, &pTab->aCol[j]);
    }else{
      continue;
    }
    if( sqlite3ExprIsConstant(0,pExpr) ) continue;
    p = sqlite3DbMallocRaw(pParse->db,  sizeof(IndexedExpr));
    if( p==0 ) break;
    p->pIENext = pParse->pIdxEpr;
#ifdef WHERETRACE_ENABLED
    if( sqlite3WhereTrace & 0x200 ){
      sqlite3DebugPrintf("New pParse->pIdxEpr term {%d,%d}\n", iIdxCur, i);
      if( sqlite3WhereTrace & 0x5000 ) sqlite3ShowExpr(pExpr);
    }
#endif
    p->pExpr = sqlite3ExprDup(pParse->db, pExpr, 0);
    p->iDataCur = pTabItem->iCursor;
    p->iIdxCur = iIdxCur;
    p->iIdxCol = i;
    p->bMaybeNullRow = (pTabItem->fg.jointype & (JT_LEFT|JT_LTORJ|JT_RIGHT))!=0;
    if( sqlite3IndexAffinityStr(pParse->db, pIdx) ){
      p->aff = pIdx->zColAff[i];
    }
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
    p->zIdxName = pIdx->zName;
#endif
    pParse->pIdxEpr = p;
    if( p->pIENext==0 ){
      void *pArg = (void*)&pParse->pIdxEpr;
      sqlite3ParserAddCleanup(pParse, whereIndexedExprCleanup, pArg);
    }
  }
}